

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  AABBNodeMB4D *node1;
  ulong uVar94;
  long lVar95;
  uint uVar96;
  int iVar97;
  ulong uVar98;
  long lVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  long lVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar122;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar164;
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [64];
  undefined1 auVar168 [32];
  uint uVar170;
  uint uVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  uint uVar175;
  uint uVar176;
  undefined1 auVar169 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  float fVar180;
  undefined1 auVar181 [16];
  float fVar186;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_ce8;
  int local_ccc;
  long local_cc8;
  undefined1 local_cc0 [8];
  float fStack_cb8;
  float fStack_cb4;
  undefined1 local_cb0 [8];
  float fStack_ca8;
  float fStack_ca4;
  Scene *local_ca0;
  ulong local_c98;
  ulong local_c90;
  long local_c88;
  ulong local_c80;
  ulong local_c78;
  long local_c70;
  ulong local_c68;
  ulong local_c60;
  ulong local_c58;
  ulong local_c50;
  ulong local_c48;
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  float local_c00;
  float local_bfc;
  float local_bf8;
  float local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  uint local_be8;
  uint local_be4;
  uint local_be0;
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800 [250];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar138 = ray->tfar;
    auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar138) {
      local_ce8 = local_800 + 1;
      auVar111 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      auVar117._8_4_ = 0x7fffffff;
      auVar117._0_8_ = 0x7fffffff7fffffff;
      auVar117._12_4_ = 0x7fffffff;
      auVar117 = vandps_avx((undefined1  [16])aVar5,auVar117);
      auVar139._8_4_ = 0x219392ef;
      auVar139._0_8_ = 0x219392ef219392ef;
      auVar139._12_4_ = 0x219392ef;
      auVar117 = vcmpps_avx(auVar117,auVar139,1);
      auVar117 = vblendvps_avx((undefined1  [16])aVar5,auVar139,auVar117);
      auVar139 = vrcpps_avx(auVar117);
      fVar145 = auVar139._0_4_;
      auVar124._0_4_ = fVar145 * auVar117._0_4_;
      fVar146 = auVar139._4_4_;
      auVar124._4_4_ = fVar146 * auVar117._4_4_;
      fVar147 = auVar139._8_4_;
      auVar124._8_4_ = fVar147 * auVar117._8_4_;
      fVar148 = auVar139._12_4_;
      auVar124._12_4_ = fVar148 * auVar117._12_4_;
      auVar140._8_4_ = 0x3f800000;
      auVar140._0_8_ = 0x3f8000003f800000;
      auVar140._12_4_ = 0x3f800000;
      auVar117 = vsubps_avx(auVar140,auVar124);
      auVar125._0_4_ = fVar145 + fVar145 * auVar117._0_4_;
      auVar125._4_4_ = fVar146 + fVar146 * auVar117._4_4_;
      auVar125._8_4_ = fVar147 + fVar147 * auVar117._8_4_;
      auVar125._12_4_ = fVar148 + fVar148 * auVar117._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_ad0._4_4_ = uVar3;
      local_ad0._0_4_ = uVar3;
      local_ad0._8_4_ = uVar3;
      local_ad0._12_4_ = uVar3;
      auVar154 = ZEXT1664(local_ad0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_ae0._4_4_ = uVar3;
      local_ae0._0_4_ = uVar3;
      local_ae0._8_4_ = uVar3;
      local_ae0._12_4_ = uVar3;
      auVar156 = ZEXT1664(local_ae0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_af0._4_4_ = uVar3;
      local_af0._0_4_ = uVar3;
      local_af0._8_4_ = uVar3;
      local_af0._12_4_ = uVar3;
      auVar161 = ZEXT1664(local_af0);
      local_b00 = vshufps_avx(auVar125,auVar125,0);
      auVar169 = ZEXT1664(local_b00);
      auVar117 = vmovshdup_avx(auVar125);
      local_b10 = vshufps_avx(auVar125,auVar125,0x55);
      auVar178 = ZEXT1664(local_b10);
      auVar139 = vshufpd_avx(auVar125,auVar125,1);
      uVar100 = (ulong)(auVar125._0_4_ < 0.0) << 4;
      local_b20 = vshufps_avx(auVar125,auVar125,0xaa);
      auVar179 = ZEXT1664(local_b20);
      uVar105 = (ulong)(auVar117._0_4_ < 0.0) << 4 | 0x20;
      uVar109 = (ulong)(auVar139._0_4_ < 0.0) << 4 | 0x40;
      uVar108 = uVar100 ^ 0x10;
      uVar110 = uVar105 ^ 0x10;
      local_b30 = vshufps_avx(auVar111,auVar111,0);
      auVar183 = ZEXT1664(local_b30);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_b40 = vshufps_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),0);
      auVar191 = ZEXT1664(local_b40);
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      auVar113._8_4_ = 0xbf800000;
      auVar113._0_8_ = 0xbf800000bf800000;
      auVar113._12_4_ = 0xbf800000;
      auVar113._16_4_ = 0xbf800000;
      auVar113._20_4_ = 0xbf800000;
      auVar113._24_4_ = 0xbf800000;
      auVar113._28_4_ = 0xbf800000;
      auVar130._8_4_ = 0x3f800000;
      auVar130._0_8_ = 0x3f8000003f800000;
      auVar130._12_4_ = 0x3f800000;
      auVar130._16_4_ = 0x3f800000;
      auVar130._20_4_ = 0x3f800000;
      auVar130._24_4_ = 0x3f800000;
      auVar130._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar130,auVar113,local_9e0);
      local_c90 = uVar100;
      local_c98 = uVar105;
LAB_00b7b0bb:
      if (local_ce8 != local_800) {
        uVar101 = local_ce8[-1];
        local_ce8 = local_ce8 + -1;
        do {
          fVar138 = (ray->dir).field_0.m128[3];
          auVar111._4_4_ = fVar138;
          auVar111._0_4_ = fVar138;
          auVar111._8_4_ = fVar138;
          auVar111._12_4_ = fVar138;
          do {
            if ((uVar101 & 8) != 0) {
              local_c88 = (ulong)((uint)uVar101 & 0xf) - 8;
              uVar101 = uVar101 & 0xfffffffffffffff0;
              local_cc8 = 0;
              goto LAB_00b7b262;
            }
            uVar94 = uVar101 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar94 + 0x80 + uVar100);
            pfVar1 = (float *)(uVar94 + 0x20 + uVar100);
            auVar115._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar115._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar115._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar115._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar117 = vsubps_avx(auVar115,auVar154._0_16_);
            auVar116._0_4_ = auVar169._0_4_ * auVar117._0_4_;
            auVar116._4_4_ = auVar169._4_4_ * auVar117._4_4_;
            auVar116._8_4_ = auVar169._8_4_ * auVar117._8_4_;
            auVar116._12_4_ = auVar169._12_4_ * auVar117._12_4_;
            pfVar2 = (float *)(uVar94 + 0x80 + uVar105);
            auVar117 = vmaxps_avx(auVar183._0_16_,auVar116);
            pfVar1 = (float *)(uVar94 + 0x20 + uVar105);
            auVar126._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar126._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar126._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar126._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar139 = vsubps_avx(auVar126,auVar156._0_16_);
            pfVar2 = (float *)(uVar94 + 0x80 + uVar109);
            pfVar1 = (float *)(uVar94 + 0x20 + uVar109);
            auVar133._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar133._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar133._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar133._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar127._0_4_ = auVar178._0_4_ * auVar139._0_4_;
            auVar127._4_4_ = auVar178._4_4_ * auVar139._4_4_;
            auVar127._8_4_ = auVar178._8_4_ * auVar139._8_4_;
            auVar127._12_4_ = auVar178._12_4_ * auVar139._12_4_;
            auVar139 = vsubps_avx(auVar133,auVar161._0_16_);
            auVar134._0_4_ = auVar179._0_4_ * auVar139._0_4_;
            auVar134._4_4_ = auVar179._4_4_ * auVar139._4_4_;
            auVar134._8_4_ = auVar179._8_4_ * auVar139._8_4_;
            auVar134._12_4_ = auVar179._12_4_ * auVar139._12_4_;
            auVar139 = vmaxps_avx(auVar127,auVar134);
            pfVar2 = (float *)(uVar94 + 0x80 + uVar108);
            pfVar1 = (float *)(uVar94 + 0x20 + uVar108);
            auVar135._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar135._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar135._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar135._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar117 = vmaxps_avx(auVar117,auVar139);
            auVar139 = vsubps_avx(auVar135,auVar154._0_16_);
            auVar128._0_4_ = auVar169._0_4_ * auVar139._0_4_;
            auVar128._4_4_ = auVar169._4_4_ * auVar139._4_4_;
            auVar128._8_4_ = auVar169._8_4_ * auVar139._8_4_;
            auVar128._12_4_ = auVar169._12_4_ * auVar139._12_4_;
            auVar139 = vminps_avx(auVar191._0_16_,auVar128);
            pfVar2 = (float *)(uVar94 + 0x80 + uVar110);
            pfVar1 = (float *)(uVar94 + 0x20 + uVar110);
            auVar136._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar136._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar136._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar136._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar124 = vsubps_avx(auVar136,auVar156._0_16_);
            auVar137._0_4_ = auVar178._0_4_ * auVar124._0_4_;
            auVar137._4_4_ = auVar178._4_4_ * auVar124._4_4_;
            auVar137._8_4_ = auVar178._8_4_ * auVar124._8_4_;
            auVar137._12_4_ = auVar178._12_4_ * auVar124._12_4_;
            pfVar2 = (float *)(uVar94 + 0x80 + (uVar109 ^ 0x10));
            pfVar1 = (float *)(uVar94 + 0x20 + (uVar109 ^ 0x10));
            auVar141._0_4_ = fVar138 * *pfVar2 + *pfVar1;
            auVar141._4_4_ = fVar138 * pfVar2[1] + pfVar1[1];
            auVar141._8_4_ = fVar138 * pfVar2[2] + pfVar1[2];
            auVar141._12_4_ = fVar138 * pfVar2[3] + pfVar1[3];
            auVar124 = vsubps_avx(auVar141,auVar161._0_16_);
            auVar142._0_4_ = auVar179._0_4_ * auVar124._0_4_;
            auVar142._4_4_ = auVar179._4_4_ * auVar124._4_4_;
            auVar142._8_4_ = auVar179._8_4_ * auVar124._8_4_;
            auVar142._12_4_ = auVar179._12_4_ * auVar124._12_4_;
            auVar124 = vminps_avx(auVar137,auVar142);
            auVar139 = vminps_avx(auVar139,auVar124);
            auVar117 = vcmpps_avx(auVar117,auVar139,2);
            if (((uint)uVar101 & 7) == 6) {
              auVar139 = vcmpps_avx(*(undefined1 (*) [16])(uVar94 + 0xe0),auVar111,2);
              auVar124 = vcmpps_avx(auVar111,*(undefined1 (*) [16])(uVar94 + 0xf0),1);
              auVar139 = vandps_avx(auVar139,auVar124);
              auVar117 = vandps_avx(auVar139,auVar117);
            }
            auVar117 = vpslld_avx(auVar117,0x1f);
            uVar96 = vmovmskps_avx(auVar117);
            if (uVar96 == 0) goto LAB_00b7b0bb;
            uVar96 = uVar96 & 0xff;
            lVar10 = 0;
            if (uVar96 != 0) {
              for (; (uVar96 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar101 = *(ulong *)(uVar94 + lVar10 * 8);
            uVar96 = uVar96 - 1 & uVar96;
            uVar98 = (ulong)uVar96;
          } while (uVar96 == 0);
          do {
            *local_ce8 = uVar101;
            local_ce8 = local_ce8 + 1;
            lVar10 = 0;
            if (uVar98 != 0) {
              for (; (uVar98 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar101 = *(ulong *)(uVar94 + lVar10 * 8);
            uVar98 = uVar98 - 1 & uVar98;
          } while (uVar98 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00b7b262:
  if (local_cc8 == local_c88) goto LAB_00b7b0bb;
  lVar95 = local_cc8 * 0x60;
  local_ca0 = context->scene;
  pRVar6 = (context->scene->geometries).items;
  pGVar7 = pRVar6[*(uint *)(uVar101 + 0x40 + lVar95)].ptr;
  fVar138 = (pGVar7->time_range).lower;
  fVar138 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar138) / ((pGVar7->time_range).upper - fVar138));
  auVar117 = vroundss_avx(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),9);
  auVar117 = vminss_avx(auVar117,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar115 = vmaxss_avx(auVar152._0_16_,auVar117);
  iVar97 = (int)auVar115._0_4_;
  lVar106 = (long)iVar97 * 0x38;
  lVar10 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar106);
  local_c58 = (ulong)*(uint *)(uVar101 + 4 + lVar95);
  auVar117 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar101 + lVar95) * 4);
  uVar94 = (ulong)*(uint *)(uVar101 + 0x10 + lVar95);
  auVar111 = *(undefined1 (*) [16])(lVar10 + uVar94 * 4);
  uVar98 = (ulong)*(uint *)(uVar101 + 0x20 + lVar95);
  auVar139 = *(undefined1 (*) [16])(lVar10 + uVar98 * 4);
  uVar102 = (ulong)*(uint *)(uVar101 + 0x30 + lVar95);
  auVar124 = *(undefined1 (*) [16])(lVar10 + uVar102 * 4);
  local_c70 = *(long *)&pRVar6[*(uint *)(uVar101 + 0x44 + lVar95)].ptr[2].numPrimitives;
  lVar10 = *(long *)(local_c70 + lVar106);
  auVar125 = *(undefined1 (*) [16])(lVar10 + local_c58 * 4);
  local_c48 = (ulong)*(uint *)(uVar101 + 0x14 + lVar95);
  auVar140 = *(undefined1 (*) [16])(lVar10 + local_c48 * 4);
  uVar103 = (ulong)*(uint *)(uVar101 + 0x24 + lVar95);
  auVar112 = *(undefined1 (*) [16])(lVar10 + uVar103 * 4);
  uVar104 = (ulong)*(uint *)(uVar101 + 0x34 + lVar95);
  auVar129 = *(undefined1 (*) [16])(lVar10 + uVar104 * 4);
  lVar10 = *(long *)&pRVar6[*(uint *)(uVar101 + 0x48 + lVar95)].ptr[2].numPrimitives;
  lVar8 = *(long *)(lVar10 + lVar106);
  uVar105 = (ulong)*(uint *)(uVar101 + 8 + lVar95);
  auVar158 = *(undefined1 (*) [16])(lVar8 + uVar105 * 4);
  local_c68 = (ulong)*(uint *)(uVar101 + 0x18 + lVar95);
  auVar181 = *(undefined1 (*) [16])(lVar8 + local_c68 * 4);
  local_c60 = (ulong)*(uint *)(uVar101 + 0x28 + lVar95);
  auVar192 = *(undefined1 (*) [16])(lVar8 + local_c60 * 4);
  local_c50 = (ulong)*(uint *)(uVar101 + 0x38 + lVar95);
  auVar194 = *(undefined1 (*) [16])(lVar8 + local_c50 * 4);
  fVar138 = fVar138 - auVar115._0_4_;
  local_a30 = ZEXT416((uint)fVar138);
  lVar8 = *(long *)&pRVar6[*(uint *)(uVar101 + 0x4c + lVar95)].ptr[2].numPrimitives;
  lVar106 = *(long *)(lVar8 + lVar106);
  uVar100 = (ulong)*(uint *)(uVar101 + 0xc + lVar95);
  auVar115 = *(undefined1 (*) [16])(lVar106 + uVar100 * 4);
  local_c80 = (ulong)*(uint *)(uVar101 + 0x1c + lVar95);
  auVar116 = *(undefined1 (*) [16])(lVar106 + local_c80 * 4);
  auVar126 = vunpcklps_avx(auVar117,auVar158);
  auVar158 = vunpckhps_avx(auVar117,auVar158);
  auVar127 = vunpcklps_avx(auVar125,auVar115);
  auVar125 = vunpckhps_avx(auVar125,auVar115);
  uVar107 = (ulong)*(uint *)(uVar101 + 0x2c + lVar95);
  auVar117 = *(undefined1 (*) [16])(lVar106 + uVar107 * 4);
  _local_a50 = vunpcklps_avx(auVar158,auVar125);
  auVar92 = _local_a50;
  _local_a90 = vunpcklps_avx(auVar126,auVar127);
  auVar141 = _local_a90;
  _local_a70 = vunpckhps_avx(auVar126,auVar127);
  auVar90 = _local_a70;
  auVar158 = vunpcklps_avx(auVar111,auVar181);
  auVar125 = vunpckhps_avx(auVar111,auVar181);
  auVar181 = vunpcklps_avx(auVar140,auVar116);
  auVar140 = vunpckhps_avx(auVar140,auVar116);
  local_c78 = (ulong)*(uint *)(uVar101 + 0x3c + lVar95);
  auVar111 = *(undefined1 (*) [16])(lVar106 + local_c78 * 4);
  _local_a40 = vunpcklps_avx(auVar125,auVar140);
  auVar93 = _local_a40;
  _local_a80 = vunpcklps_avx(auVar158,auVar181);
  auVar142 = _local_a80;
  _local_a60 = vunpckhps_avx(auVar158,auVar181);
  auVar91 = _local_a60;
  auVar140 = vunpcklps_avx(auVar139,auVar192);
  auVar139 = vunpckhps_avx(auVar139,auVar192);
  auVar158 = vunpcklps_avx(auVar112,auVar117);
  auVar125 = vunpckhps_avx(auVar112,auVar117);
  lVar99 = (long)(iVar97 + 1) * 0x38;
  lVar106 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar99);
  auVar117 = *(undefined1 (*) [16])(lVar106 + (ulong)*(uint *)(uVar101 + lVar95) * 4);
  _local_cb0 = vunpcklps_avx(auVar139,auVar125);
  auVar134 = _local_cb0;
  _local_ac0 = vunpcklps_avx(auVar140,auVar158);
  auVar135 = _local_ac0;
  _local_aa0 = vunpckhps_avx(auVar140,auVar158);
  auVar137 = _local_aa0;
  auVar125 = vunpcklps_avx(auVar124,auVar194);
  auVar139 = vunpckhps_avx(auVar124,auVar194);
  auVar140 = vunpcklps_avx(auVar129,auVar111);
  auVar124 = vunpckhps_avx(auVar129,auVar111);
  lVar10 = *(long *)(lVar10 + lVar99);
  auVar111 = *(undefined1 (*) [16])(lVar10 + uVar105 * 4);
  _local_cc0 = vunpcklps_avx(auVar139,auVar124);
  auVar133 = _local_cc0;
  auVar112 = vunpcklps_avx(auVar125,auVar140);
  _local_ab0 = vunpckhps_avx(auVar125,auVar140);
  auVar136 = _local_ab0;
  lVar9 = *(long *)(local_c70 + lVar99);
  auVar124 = vunpcklps_avx(auVar117,auVar111);
  auVar139 = vunpckhps_avx(auVar117,auVar111);
  auVar117 = *(undefined1 (*) [16])(lVar9 + local_c58 * 4);
  lVar8 = *(long *)(lVar8 + lVar99);
  auVar111 = *(undefined1 (*) [16])(lVar8 + uVar100 * 4);
  auVar125 = vunpcklps_avx(auVar117,auVar111);
  auVar117 = vunpckhps_avx(auVar117,auVar111);
  auVar129 = vunpcklps_avx(auVar139,auVar117);
  auVar158 = vunpcklps_avx(auVar124,auVar125);
  auVar139 = vunpckhps_avx(auVar124,auVar125);
  auVar117 = *(undefined1 (*) [16])(lVar106 + uVar94 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar10 + local_c68 * 4);
  auVar125 = vunpcklps_avx(auVar117,auVar111);
  auVar124 = vunpckhps_avx(auVar117,auVar111);
  auVar117 = *(undefined1 (*) [16])(lVar9 + local_c48 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar8 + local_c80 * 4);
  auVar140 = vunpcklps_avx(auVar117,auVar111);
  auVar117 = vunpckhps_avx(auVar117,auVar111);
  auVar181 = vunpcklps_avx(auVar124,auVar117);
  auVar192 = vunpcklps_avx(auVar125,auVar140);
  auVar124 = vunpckhps_avx(auVar125,auVar140);
  auVar117 = *(undefined1 (*) [16])(lVar106 + uVar98 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar10 + local_c60 * 4);
  auVar140 = vunpcklps_avx(auVar117,auVar111);
  auVar125 = vunpckhps_avx(auVar117,auVar111);
  auVar117 = *(undefined1 (*) [16])(lVar9 + uVar103 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar8 + uVar107 * 4);
  auVar194 = vunpcklps_avx(auVar117,auVar111);
  auVar117 = vunpckhps_avx(auVar117,auVar111);
  auVar115 = vunpcklps_avx(auVar125,auVar117);
  auVar116 = vunpcklps_avx(auVar140,auVar194);
  auVar125 = vunpckhps_avx(auVar140,auVar194);
  auVar117 = *(undefined1 (*) [16])(lVar106 + uVar102 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar10 + local_c50 * 4);
  auVar194 = vunpcklps_avx(auVar117,auVar111);
  auVar140 = vunpckhps_avx(auVar117,auVar111);
  auVar117 = *(undefined1 (*) [16])(lVar9 + uVar104 * 4);
  auVar111 = *(undefined1 (*) [16])(lVar8 + local_c78 * 4);
  auVar126 = vunpcklps_avx(auVar117,auVar111);
  auVar117 = vunpckhps_avx(auVar117,auVar111);
  auVar127 = vunpcklps_avx(auVar140,auVar117);
  auVar128 = vunpcklps_avx(auVar194,auVar126);
  auVar140 = vunpckhps_avx(auVar194,auVar126);
  auVar117 = vshufps_avx(local_a30,local_a30,0);
  auVar111 = ZEXT416((uint)(1.0 - fVar138));
  auVar111 = vshufps_avx(auVar111,auVar111,0);
  fVar138 = auVar117._0_4_;
  fVar145 = auVar117._4_4_;
  fVar146 = auVar117._8_4_;
  fVar147 = auVar117._12_4_;
  fVar148 = auVar111._0_4_;
  fVar149 = auVar111._4_4_;
  fVar122 = auVar111._8_4_;
  fVar123 = auVar111._12_4_;
  auVar143._4_4_ = fVar149 * (float)local_a90._4_4_ + auVar158._4_4_ * fVar145;
  auVar143._0_4_ = fVar148 * (float)local_a90._0_4_ + auVar158._0_4_ * fVar138;
  auVar143._8_4_ = fVar122 * fStack_a88 + auVar158._8_4_ * fVar146;
  auVar143._12_4_ = fVar123 * fStack_a84 + auVar158._12_4_ * fVar147;
  auVar150._4_4_ = fVar149 * (float)local_a70._4_4_ + auVar139._4_4_ * fVar145;
  auVar150._0_4_ = fVar148 * (float)local_a70._0_4_ + auVar139._0_4_ * fVar138;
  auVar150._8_4_ = fVar122 * fStack_a68 + auVar139._8_4_ * fVar146;
  auVar150._12_4_ = fVar123 * fStack_a64 + auVar139._12_4_ * fVar147;
  auVar155._4_4_ = fVar149 * (float)local_a50._4_4_ + auVar129._4_4_ * fVar145;
  auVar155._0_4_ = fVar148 * (float)local_a50._0_4_ + auVar129._0_4_ * fVar138;
  auVar155._8_4_ = fVar122 * fStack_a48 + auVar129._8_4_ * fVar146;
  auVar155._12_4_ = fVar123 * fStack_a44 + auVar129._12_4_ * fVar147;
  auVar158._0_4_ = fVar148 * (float)local_a80._0_4_ + fVar138 * auVar192._0_4_;
  auVar158._4_4_ = fVar149 * (float)local_a80._4_4_ + fVar145 * auVar192._4_4_;
  auVar158._8_4_ = fVar122 * fStack_a78 + fVar146 * auVar192._8_4_;
  auVar158._12_4_ = fVar123 * fStack_a74 + fVar147 * auVar192._12_4_;
  auVar129._0_4_ = fVar148 * (float)local_a60._0_4_ + fVar138 * auVar124._0_4_;
  auVar129._4_4_ = fVar149 * (float)local_a60._4_4_ + fVar145 * auVar124._4_4_;
  auVar129._8_4_ = fVar122 * fStack_a58 + fVar146 * auVar124._8_4_;
  auVar129._12_4_ = fVar123 * fStack_a54 + fVar147 * auVar124._12_4_;
  auVar192._0_4_ = fVar148 * (float)local_a40._0_4_ + auVar181._0_4_ * fVar138;
  auVar192._4_4_ = fVar149 * (float)local_a40._4_4_ + auVar181._4_4_ * fVar145;
  auVar192._8_4_ = fVar122 * fStack_a38 + auVar181._8_4_ * fVar146;
  auVar192._12_4_ = fVar123 * fStack_a34 + auVar181._12_4_ * fVar147;
  auVar143._20_4_ = fVar149 * (float)local_ac0._4_4_ + fVar145 * auVar116._4_4_;
  auVar143._16_4_ = fVar148 * (float)local_ac0._0_4_ + fVar138 * auVar116._0_4_;
  auVar143._24_4_ = fVar122 * fStack_ab8 + fVar146 * auVar116._8_4_;
  auVar143._28_4_ = fVar123 * fStack_ab4 + fVar147 * auVar116._12_4_;
  auVar150._20_4_ = fVar149 * (float)local_aa0._4_4_ + auVar125._4_4_ * fVar145;
  auVar150._16_4_ = fVar148 * (float)local_aa0._0_4_ + auVar125._0_4_ * fVar138;
  auVar150._24_4_ = fVar122 * fStack_a98 + auVar125._8_4_ * fVar146;
  auVar150._28_4_ = fVar123 * fStack_a94 + auVar125._12_4_ * fVar147;
  auVar155._20_4_ = fVar149 * (float)local_cb0._4_4_ + auVar115._4_4_ * fVar145;
  auVar155._16_4_ = fVar148 * (float)local_cb0._0_4_ + auVar115._0_4_ * fVar138;
  auVar155._24_4_ = fVar122 * fStack_ca8 + auVar115._8_4_ * fVar146;
  auVar155._28_4_ = fVar123 * fStack_ca4 + auVar115._12_4_ * fVar147;
  auVar194._0_4_ = auVar112._0_4_ * fVar148 + fVar138 * auVar128._0_4_;
  auVar194._4_4_ = auVar112._4_4_ * fVar149 + fVar145 * auVar128._4_4_;
  auVar194._8_4_ = auVar112._8_4_ * fVar122 + fVar146 * auVar128._8_4_;
  auVar194._12_4_ = auVar112._12_4_ * fVar123 + fVar147 * auVar128._12_4_;
  lVar10 = uVar101 + 0x40 + lVar95;
  local_9a0 = *(undefined8 *)(lVar10 + 0x10);
  uStack_998 = *(undefined8 *)(lVar10 + 0x18);
  uStack_990 = local_9a0;
  uStack_988 = uStack_998;
  lVar95 = uVar101 + 0x50 + lVar95;
  local_9c0 = *(undefined8 *)(lVar95 + 0x10);
  uStack_9b8 = *(undefined8 *)(lVar95 + 0x18);
  auVar181._0_4_ = fVar148 * (float)local_ab0._0_4_ + fVar138 * auVar140._0_4_;
  auVar181._4_4_ = fVar149 * (float)local_ab0._4_4_ + fVar145 * auVar140._4_4_;
  auVar181._8_4_ = fVar122 * fStack_aa8 + fVar146 * auVar140._8_4_;
  auVar181._12_4_ = fVar123 * fStack_aa4 + fVar147 * auVar140._12_4_;
  auVar112._0_4_ = fVar148 * (float)local_cc0._0_4_ + fVar138 * auVar127._0_4_;
  auVar112._4_4_ = fVar149 * (float)local_cc0._4_4_ + fVar145 * auVar127._4_4_;
  auVar112._8_4_ = fVar122 * fStack_cb8 + fVar146 * auVar127._8_4_;
  auVar112._12_4_ = fVar123 * fStack_cb4 + fVar147 * auVar127._12_4_;
  uStack_9b0 = local_9c0;
  uStack_9a8 = uStack_9b8;
  auVar118._16_16_ = auVar158;
  auVar118._0_16_ = auVar158;
  auVar131._16_16_ = auVar129;
  auVar131._0_16_ = auVar129;
  auVar159._16_16_ = auVar192;
  auVar159._0_16_ = auVar192;
  auVar168._16_16_ = auVar194;
  auVar168._0_16_ = auVar194;
  auVar177._16_16_ = auVar181;
  auVar177._0_16_ = auVar181;
  auVar114._16_16_ = auVar112;
  auVar114._0_16_ = auVar112;
  local_c20 = vsubps_avx(auVar143,auVar118);
  local_b60 = vsubps_avx(auVar150,auVar131);
  auVar113 = vsubps_avx(auVar155,auVar159);
  auVar130 = vsubps_avx(auVar168,auVar143);
  auVar118 = vsubps_avx(auVar177,auVar150);
  auVar114 = vsubps_avx(auVar114,auVar155);
  fVar147 = auVar114._0_4_;
  fVar180 = local_b60._0_4_;
  fVar15 = auVar114._4_4_;
  fVar184 = local_b60._4_4_;
  auVar75._4_4_ = fVar184 * fVar15;
  auVar75._0_4_ = fVar180 * fVar147;
  fVar25 = auVar114._8_4_;
  fVar185 = local_b60._8_4_;
  auVar75._8_4_ = fVar185 * fVar25;
  fVar35 = auVar114._12_4_;
  fVar186 = local_b60._12_4_;
  auVar75._12_4_ = fVar186 * fVar35;
  fVar45 = auVar114._16_4_;
  fVar187 = local_b60._16_4_;
  auVar75._16_4_ = fVar187 * fVar45;
  fVar55 = auVar114._20_4_;
  fVar188 = local_b60._20_4_;
  auVar75._20_4_ = fVar188 * fVar55;
  fVar65 = auVar114._24_4_;
  fVar189 = local_b60._24_4_;
  auVar75._24_4_ = fVar189 * fVar65;
  auVar75._28_4_ = auVar112._12_4_;
  fVar148 = auVar118._0_4_;
  fVar157 = auVar113._0_4_;
  fVar16 = auVar118._4_4_;
  fVar162 = auVar113._4_4_;
  auVar76._4_4_ = fVar162 * fVar16;
  auVar76._0_4_ = fVar157 * fVar148;
  fVar26 = auVar118._8_4_;
  fVar163 = auVar113._8_4_;
  auVar76._8_4_ = fVar163 * fVar26;
  fVar36 = auVar118._12_4_;
  fVar164 = auVar113._12_4_;
  auVar76._12_4_ = fVar164 * fVar36;
  fVar46 = auVar118._16_4_;
  fVar165 = auVar113._16_4_;
  auVar76._16_4_ = fVar165 * fVar46;
  fVar56 = auVar118._20_4_;
  fVar166 = auVar113._20_4_;
  auVar76._20_4_ = fVar166 * fVar56;
  fVar66 = auVar118._24_4_;
  fVar167 = auVar113._24_4_;
  auVar76._24_4_ = fVar167 * fVar66;
  auVar76._28_4_ = auVar158._12_4_;
  local_b80 = vsubps_avx(auVar76,auVar75);
  fVar149 = auVar130._0_4_;
  fVar17 = auVar130._4_4_;
  auVar77._4_4_ = fVar162 * fVar17;
  auVar77._0_4_ = fVar157 * fVar149;
  fVar27 = auVar130._8_4_;
  auVar77._8_4_ = fVar163 * fVar27;
  fVar37 = auVar130._12_4_;
  auVar77._12_4_ = fVar164 * fVar37;
  fVar47 = auVar130._16_4_;
  auVar77._16_4_ = fVar165 * fVar47;
  fVar57 = auVar130._20_4_;
  auVar77._20_4_ = fVar166 * fVar57;
  fVar67 = auVar130._24_4_;
  auVar77._24_4_ = fVar167 * fVar67;
  auVar77._28_4_ = auVar158._12_4_;
  fVar122 = local_c20._0_4_;
  fVar18 = local_c20._4_4_;
  auVar78._4_4_ = fVar15 * fVar18;
  auVar78._0_4_ = fVar147 * fVar122;
  fVar28 = local_c20._8_4_;
  auVar78._8_4_ = fVar25 * fVar28;
  fVar38 = local_c20._12_4_;
  auVar78._12_4_ = fVar35 * fVar38;
  fVar48 = local_c20._16_4_;
  auVar78._16_4_ = fVar45 * fVar48;
  fVar58 = local_c20._20_4_;
  auVar78._20_4_ = fVar55 * fVar58;
  fVar68 = local_c20._24_4_;
  auVar78._24_4_ = fVar65 * fVar68;
  auVar78._28_4_ = auVar129._12_4_;
  auVar113 = vsubps_avx(auVar78,auVar77);
  auVar79._4_4_ = fVar16 * fVar18;
  auVar79._0_4_ = fVar148 * fVar122;
  auVar79._8_4_ = fVar26 * fVar28;
  auVar79._12_4_ = fVar36 * fVar38;
  auVar79._16_4_ = fVar46 * fVar48;
  auVar79._20_4_ = fVar56 * fVar58;
  auVar79._24_4_ = fVar66 * fVar68;
  auVar79._28_4_ = auVar129._12_4_;
  auVar80._4_4_ = fVar184 * fVar17;
  auVar80._0_4_ = fVar180 * fVar149;
  auVar80._8_4_ = fVar185 * fVar27;
  auVar80._12_4_ = fVar186 * fVar37;
  auVar80._16_4_ = fVar187 * fVar47;
  auVar80._20_4_ = fVar188 * fVar57;
  auVar80._24_4_ = fVar189 * fVar67;
  auVar80._28_4_ = local_b60._28_4_;
  local_c40 = vsubps_avx(auVar80,auVar79);
  uVar3 = *(undefined4 *)&(ray->org).field_0;
  auVar182._4_4_ = uVar3;
  auVar182._0_4_ = uVar3;
  auVar182._8_4_ = uVar3;
  auVar182._12_4_ = uVar3;
  auVar182._16_4_ = uVar3;
  auVar182._20_4_ = uVar3;
  auVar182._24_4_ = uVar3;
  auVar182._28_4_ = uVar3;
  uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar190._4_4_ = uVar3;
  auVar190._0_4_ = uVar3;
  auVar190._8_4_ = uVar3;
  auVar190._12_4_ = uVar3;
  auVar190._16_4_ = uVar3;
  auVar190._20_4_ = uVar3;
  auVar190._24_4_ = uVar3;
  auVar190._28_4_ = uVar3;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar193._4_4_ = uVar4;
  auVar193._0_4_ = uVar4;
  auVar193._8_4_ = uVar4;
  auVar193._12_4_ = uVar4;
  auVar193._16_4_ = uVar4;
  auVar193._20_4_ = uVar4;
  auVar193._24_4_ = uVar4;
  auVar193._28_4_ = uVar4;
  fVar138 = (ray->dir).field_0.m128[1];
  local_ba0 = vsubps_avx(auVar143,auVar182);
  fVar145 = (ray->dir).field_0.m128[2];
  auVar75 = vsubps_avx(auVar150,auVar190);
  auVar76 = vsubps_avx(auVar155,auVar193);
  fVar123 = auVar76._0_4_;
  fVar19 = auVar76._4_4_;
  auVar81._4_4_ = fVar138 * fVar19;
  auVar81._0_4_ = fVar138 * fVar123;
  fVar29 = auVar76._8_4_;
  auVar81._8_4_ = fVar138 * fVar29;
  fVar39 = auVar76._12_4_;
  auVar81._12_4_ = fVar138 * fVar39;
  fVar49 = auVar76._16_4_;
  auVar81._16_4_ = fVar138 * fVar49;
  fVar59 = auVar76._20_4_;
  auVar81._20_4_ = fVar138 * fVar59;
  fVar69 = auVar76._24_4_;
  auVar81._24_4_ = fVar138 * fVar69;
  auVar81._28_4_ = uVar3;
  fVar144 = auVar75._0_4_;
  fVar20 = auVar75._4_4_;
  auVar82._4_4_ = fVar145 * fVar20;
  auVar82._0_4_ = fVar145 * fVar144;
  fVar30 = auVar75._8_4_;
  auVar82._8_4_ = fVar145 * fVar30;
  fVar40 = auVar75._12_4_;
  auVar82._12_4_ = fVar145 * fVar40;
  fVar50 = auVar75._16_4_;
  auVar82._16_4_ = fVar145 * fVar50;
  fVar60 = auVar75._20_4_;
  auVar82._20_4_ = fVar145 * fVar60;
  fVar70 = auVar75._24_4_;
  auVar82._24_4_ = fVar145 * fVar70;
  auVar82._28_4_ = uVar4;
  auVar75 = vsubps_avx(auVar82,auVar81);
  fVar146 = (ray->dir).field_0.m128[0];
  fVar11 = local_ba0._0_4_;
  fVar21 = local_ba0._4_4_;
  auVar83._4_4_ = fVar145 * fVar21;
  auVar83._0_4_ = fVar145 * fVar11;
  fVar31 = local_ba0._8_4_;
  auVar83._8_4_ = fVar145 * fVar31;
  fVar41 = local_ba0._12_4_;
  auVar83._12_4_ = fVar145 * fVar41;
  fVar51 = local_ba0._16_4_;
  auVar83._16_4_ = fVar145 * fVar51;
  fVar61 = local_ba0._20_4_;
  auVar83._20_4_ = fVar145 * fVar61;
  fVar71 = local_ba0._24_4_;
  auVar83._24_4_ = fVar145 * fVar71;
  auVar83._28_4_ = local_b80._28_4_;
  auVar84._4_4_ = fVar146 * fVar19;
  auVar84._0_4_ = fVar146 * fVar123;
  auVar84._8_4_ = fVar146 * fVar29;
  auVar84._12_4_ = fVar146 * fVar39;
  auVar84._16_4_ = fVar146 * fVar49;
  auVar84._20_4_ = fVar146 * fVar59;
  auVar84._24_4_ = fVar146 * fVar69;
  auVar84._28_4_ = auVar158._12_4_;
  auVar76 = vsubps_avx(auVar84,auVar83);
  auVar85._4_4_ = fVar146 * fVar20;
  auVar85._0_4_ = fVar146 * fVar144;
  auVar85._8_4_ = fVar146 * fVar30;
  auVar85._12_4_ = fVar146 * fVar40;
  auVar85._16_4_ = fVar146 * fVar50;
  auVar85._20_4_ = fVar146 * fVar60;
  auVar85._24_4_ = fVar146 * fVar70;
  auVar85._28_4_ = auVar158._12_4_;
  auVar86._4_4_ = fVar138 * fVar21;
  auVar86._0_4_ = fVar138 * fVar11;
  auVar86._8_4_ = fVar138 * fVar31;
  auVar86._12_4_ = fVar138 * fVar41;
  auVar86._16_4_ = fVar138 * fVar51;
  auVar86._20_4_ = fVar138 * fVar61;
  auVar86._24_4_ = fVar138 * fVar71;
  auVar86._28_4_ = local_ba0._28_4_;
  auVar77 = vsubps_avx(auVar86,auVar85);
  fVar12 = local_c40._0_4_;
  fVar22 = local_c40._4_4_;
  fVar32 = local_c40._8_4_;
  fVar42 = local_c40._12_4_;
  fVar52 = local_c40._16_4_;
  fVar62 = local_c40._20_4_;
  fVar72 = local_c40._24_4_;
  fVar13 = auVar113._0_4_;
  fVar23 = auVar113._4_4_;
  fVar33 = auVar113._8_4_;
  fVar43 = auVar113._12_4_;
  fVar53 = auVar113._16_4_;
  fVar63 = auVar113._20_4_;
  fVar73 = auVar113._24_4_;
  fVar14 = local_b80._0_4_;
  fVar24 = local_b80._4_4_;
  fVar34 = local_b80._8_4_;
  fVar44 = local_b80._12_4_;
  fVar54 = local_b80._16_4_;
  fVar64 = local_b80._20_4_;
  fVar74 = local_b80._24_4_;
  auVar132._0_4_ = fVar146 * fVar14 + fVar138 * fVar13 + fVar145 * fVar12;
  auVar132._4_4_ = fVar146 * fVar24 + fVar138 * fVar23 + fVar145 * fVar22;
  auVar132._8_4_ = fVar146 * fVar34 + fVar138 * fVar33 + fVar145 * fVar32;
  auVar132._12_4_ = fVar146 * fVar44 + fVar138 * fVar43 + fVar145 * fVar42;
  auVar132._16_4_ = fVar146 * fVar54 + fVar138 * fVar53 + fVar145 * fVar52;
  auVar132._20_4_ = fVar146 * fVar64 + fVar138 * fVar63 + fVar145 * fVar62;
  auVar132._24_4_ = fVar146 * fVar74 + fVar138 * fVar73 + fVar145 * fVar72;
  auVar132._28_4_ = fVar145 + fVar145 + local_ba0._28_4_;
  auVar119._8_4_ = 0x80000000;
  auVar119._0_8_ = 0x8000000080000000;
  auVar119._12_4_ = 0x80000000;
  auVar119._16_4_ = 0x80000000;
  auVar119._20_4_ = 0x80000000;
  auVar119._24_4_ = 0x80000000;
  auVar119._28_4_ = 0x80000000;
  auVar113 = vandps_avx(auVar132,auVar119);
  uVar96 = auVar113._0_4_;
  auVar153._0_4_ =
       (float)(uVar96 ^ (uint)(fVar149 * auVar75._0_4_ +
                              fVar148 * auVar76._0_4_ + fVar147 * auVar77._0_4_));
  uVar170 = auVar113._4_4_;
  auVar153._4_4_ =
       (float)(uVar170 ^
              (uint)(fVar17 * auVar75._4_4_ + fVar16 * auVar76._4_4_ + fVar15 * auVar77._4_4_));
  uVar171 = auVar113._8_4_;
  auVar153._8_4_ =
       (float)(uVar171 ^
              (uint)(fVar27 * auVar75._8_4_ + fVar26 * auVar76._8_4_ + fVar25 * auVar77._8_4_));
  uVar172 = auVar113._12_4_;
  auVar153._12_4_ =
       (float)(uVar172 ^
              (uint)(fVar37 * auVar75._12_4_ + fVar36 * auVar76._12_4_ + fVar35 * auVar77._12_4_));
  uVar173 = auVar113._16_4_;
  auVar153._16_4_ =
       (float)(uVar173 ^
              (uint)(fVar47 * auVar75._16_4_ + fVar46 * auVar76._16_4_ + fVar45 * auVar77._16_4_));
  uVar174 = auVar113._20_4_;
  auVar153._20_4_ =
       (float)(uVar174 ^
              (uint)(fVar57 * auVar75._20_4_ + fVar56 * auVar76._20_4_ + fVar55 * auVar77._20_4_));
  uVar175 = auVar113._24_4_;
  auVar153._24_4_ =
       (float)(uVar175 ^
              (uint)(fVar67 * auVar75._24_4_ + fVar66 * auVar76._24_4_ + fVar65 * auVar77._24_4_));
  uVar176 = auVar113._28_4_;
  auVar153._28_4_ = (float)(uVar176 ^ (uint)(auVar130._28_4_ + auVar118._28_4_ + auVar114._28_4_));
  auVar160._0_4_ =
       (float)(uVar96 ^ (uint)(auVar75._0_4_ * fVar122 +
                              auVar76._0_4_ * fVar180 + fVar157 * auVar77._0_4_));
  auVar160._4_4_ =
       (float)(uVar170 ^
              (uint)(auVar75._4_4_ * fVar18 + auVar76._4_4_ * fVar184 + fVar162 * auVar77._4_4_));
  auVar160._8_4_ =
       (float)(uVar171 ^
              (uint)(auVar75._8_4_ * fVar28 + auVar76._8_4_ * fVar185 + fVar163 * auVar77._8_4_));
  auVar160._12_4_ =
       (float)(uVar172 ^
              (uint)(auVar75._12_4_ * fVar38 + auVar76._12_4_ * fVar186 + fVar164 * auVar77._12_4_))
  ;
  auVar160._16_4_ =
       (float)(uVar173 ^
              (uint)(auVar75._16_4_ * fVar48 + auVar76._16_4_ * fVar187 + fVar165 * auVar77._16_4_))
  ;
  auVar160._20_4_ =
       (float)(uVar174 ^
              (uint)(auVar75._20_4_ * fVar58 + auVar76._20_4_ * fVar188 + fVar166 * auVar77._20_4_))
  ;
  auVar160._24_4_ =
       (float)(uVar175 ^
              (uint)(auVar75._24_4_ * fVar68 + auVar76._24_4_ * fVar189 + fVar167 * auVar77._24_4_))
  ;
  auVar160._28_4_ = (float)(uVar176 ^ (uint)(auVar76._28_4_ + auVar77._28_4_ + -0.0));
  auVar130 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar113 = vcmpps_avx(auVar153,auVar130,5);
  auVar130 = vcmpps_avx(auVar160,auVar130,5);
  auVar113 = vandps_avx(auVar113,auVar130);
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  local_920 = vandps_avx(auVar132,auVar120);
  auVar130 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar132,4);
  auVar113 = vandps_avx(auVar113,auVar130);
  auVar121._0_4_ = auVar160._0_4_ + auVar153._0_4_;
  auVar121._4_4_ = auVar160._4_4_ + auVar153._4_4_;
  auVar121._8_4_ = auVar160._8_4_ + auVar153._8_4_;
  auVar121._12_4_ = auVar160._12_4_ + auVar153._12_4_;
  auVar121._16_4_ = auVar160._16_4_ + auVar153._16_4_;
  auVar121._20_4_ = auVar160._20_4_ + auVar153._20_4_;
  auVar121._24_4_ = auVar160._24_4_ + auVar153._24_4_;
  auVar121._28_4_ = auVar160._28_4_ + auVar153._28_4_;
  auVar118 = vcmpps_avx(auVar121,local_920,2);
  auVar130 = vandps_avx(auVar113,auVar118);
  auVar114 = local_a20 & auVar130;
  if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar114 >> 0x7f,0) != '\0') ||
        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar114 >> 0xbf,0) != '\0') ||
      (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar114[0x1f] < '\0')
  {
    auVar130 = vandps_avx(auVar130,local_a20);
    local_940._0_4_ =
         (float)(uVar96 ^ (uint)(fVar14 * fVar11 + fVar13 * fVar144 + fVar123 * fVar12));
    local_940._4_4_ = (float)(uVar170 ^ (uint)(fVar24 * fVar21 + fVar23 * fVar20 + fVar19 * fVar22))
    ;
    local_940._8_4_ = (float)(uVar171 ^ (uint)(fVar34 * fVar31 + fVar33 * fVar30 + fVar29 * fVar32))
    ;
    local_940._12_4_ =
         (float)(uVar172 ^ (uint)(fVar44 * fVar41 + fVar43 * fVar40 + fVar39 * fVar42));
    local_940._16_4_ =
         (float)(uVar173 ^ (uint)(fVar54 * fVar51 + fVar53 * fVar50 + fVar49 * fVar52));
    local_940._20_4_ =
         (float)(uVar174 ^ (uint)(fVar64 * fVar61 + fVar63 * fVar60 + fVar59 * fVar62));
    local_940._24_4_ =
         (float)(uVar175 ^ (uint)(fVar74 * fVar71 + fVar73 * fVar70 + fVar69 * fVar72));
    local_940._28_4_ = uVar176 ^ (uint)(auVar118._28_4_ + auVar118._28_4_ + auVar113._28_4_);
    fVar138 = (ray->org).field_0.m128[3];
    fVar145 = local_920._0_4_;
    fVar146 = local_920._4_4_;
    auVar87._4_4_ = fVar146 * fVar138;
    auVar87._0_4_ = fVar145 * fVar138;
    fVar147 = local_920._8_4_;
    auVar87._8_4_ = fVar147 * fVar138;
    fVar148 = local_920._12_4_;
    auVar87._12_4_ = fVar148 * fVar138;
    fVar149 = local_920._16_4_;
    auVar87._16_4_ = fVar149 * fVar138;
    fVar122 = local_920._20_4_;
    auVar87._20_4_ = fVar122 * fVar138;
    fVar123 = local_920._24_4_;
    auVar87._24_4_ = fVar123 * fVar138;
    auVar87._28_4_ = fVar138;
    auVar113 = vcmpps_avx(auVar87,local_940,1);
    fVar138 = ray->tfar;
    auVar88._4_4_ = fVar146 * fVar138;
    auVar88._0_4_ = fVar145 * fVar138;
    auVar88._8_4_ = fVar147 * fVar138;
    auVar88._12_4_ = fVar148 * fVar138;
    auVar88._16_4_ = fVar149 * fVar138;
    auVar88._20_4_ = fVar122 * fVar138;
    auVar88._24_4_ = fVar123 * fVar138;
    auVar88._28_4_ = fVar138;
    auVar118 = vcmpps_avx(local_940,auVar88,2);
    auVar113 = vandps_avx(auVar118,auVar113);
    auVar118 = auVar130 & auVar113;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar118 >> 0x7f,0) != '\0') ||
          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar118 >> 0xbf,0) != '\0') ||
        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar118[0x1f] < '\0') {
      local_8e0 = vandps_avx(auVar130,auVar113);
      auVar113 = vsubps_avx(local_920,auVar160);
      local_980 = vblendvps_avx(auVar153,auVar113,local_9e0);
      auVar113 = vsubps_avx(local_920,auVar153);
      local_960 = vblendvps_avx(auVar160,auVar113,local_9e0);
      uStack_844 = local_9e0._28_4_;
      local_860[0] = fVar14 * (float)local_a00._0_4_;
      local_860[1] = fVar24 * (float)local_a00._4_4_;
      local_860[2] = fVar34 * fStack_9f8;
      local_860[3] = fVar44 * fStack_9f4;
      fStack_850 = fVar54 * fStack_9f0;
      fStack_84c = fVar64 * fStack_9ec;
      fStack_848 = fVar74 * fStack_9e8;
      local_840[0] = fVar13 * (float)local_a00._0_4_;
      local_840[1] = fVar23 * (float)local_a00._4_4_;
      local_840[2] = fVar33 * fStack_9f8;
      local_840[3] = fVar43 * fStack_9f4;
      fStack_830 = fVar53 * fStack_9f0;
      fStack_82c = fVar63 * fStack_9ec;
      fStack_828 = fVar73 * fStack_9e8;
      uStack_824 = uStack_844;
      auVar113 = vrcpps_avx(local_920);
      local_820[0] = (float)local_a00._0_4_ * fVar12;
      local_820[1] = (float)local_a00._4_4_ * fVar22;
      local_820[2] = fStack_9f8 * fVar32;
      local_820[3] = fStack_9f4 * fVar42;
      fStack_810 = fStack_9f0 * fVar52;
      fStack_80c = fStack_9ec * fVar62;
      fStack_808 = fStack_9e8 * fVar72;
      uStack_804 = uStack_844;
      fVar138 = auVar113._0_4_;
      fVar144 = auVar113._4_4_;
      auVar89._4_4_ = fVar146 * fVar144;
      auVar89._0_4_ = fVar145 * fVar138;
      fVar145 = auVar113._8_4_;
      auVar89._8_4_ = fVar147 * fVar145;
      fVar146 = auVar113._12_4_;
      auVar89._12_4_ = fVar148 * fVar146;
      fVar147 = auVar113._16_4_;
      auVar89._16_4_ = fVar149 * fVar147;
      fVar148 = auVar113._20_4_;
      auVar89._20_4_ = fVar122 * fVar148;
      fVar149 = auVar113._24_4_;
      auVar89._24_4_ = fVar123 * fVar149;
      auVar89._28_4_ = local_920._28_4_;
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = 0x3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar151._16_4_ = 0x3f800000;
      auVar151._20_4_ = 0x3f800000;
      auVar151._24_4_ = 0x3f800000;
      auVar151._28_4_ = 0x3f800000;
      auVar113 = vsubps_avx(auVar151,auVar89);
      fVar138 = fVar138 + fVar138 * auVar113._0_4_;
      fVar144 = fVar144 + fVar144 * auVar113._4_4_;
      fVar145 = fVar145 + fVar145 * auVar113._8_4_;
      fVar146 = fVar146 + fVar146 * auVar113._12_4_;
      fVar147 = fVar147 + fVar147 * auVar113._16_4_;
      fVar148 = fVar148 + fVar148 * auVar113._20_4_;
      fVar149 = fVar149 + fVar149 * auVar113._24_4_;
      local_880._4_4_ = fVar144 * local_940._4_4_;
      local_880._0_4_ = fVar138 * local_940._0_4_;
      local_880._8_4_ = fVar145 * local_940._8_4_;
      local_880._12_4_ = fVar146 * local_940._12_4_;
      local_880._16_4_ = fVar147 * local_940._16_4_;
      local_880._20_4_ = fVar148 * local_940._20_4_;
      local_880._24_4_ = fVar149 * local_940._24_4_;
      local_880._28_4_ = local_940._28_4_;
      local_8c0[0] = local_980._0_4_ * fVar138;
      local_8c0[1] = local_980._4_4_ * fVar144;
      local_8c0[2] = local_980._8_4_ * fVar145;
      local_8c0[3] = local_980._12_4_ * fVar146;
      fStack_8b0 = local_980._16_4_ * fVar147;
      fStack_8ac = local_980._20_4_ * fVar148;
      fStack_8a8 = local_980._24_4_ * fVar149;
      uStack_8a4 = local_980._28_4_;
      local_8a0._4_4_ = local_960._4_4_ * fVar144;
      local_8a0._0_4_ = local_960._0_4_ * fVar138;
      local_8a0._8_4_ = local_960._8_4_ * fVar145;
      local_8a0._12_4_ = local_960._12_4_ * fVar146;
      local_8a0._16_4_ = local_960._16_4_ * fVar147;
      local_8a0._20_4_ = local_960._20_4_ * fVar148;
      local_8a0._24_4_ = local_960._24_4_ * fVar149;
      local_8a0._28_4_ = local_980._28_4_;
      uVar96 = vmovmskps_avx(local_8e0);
      uVar100 = (ulong)uVar96;
      _local_cc0 = auVar133;
      _local_cb0 = auVar134;
      _local_ac0 = auVar135;
      _local_ab0 = auVar136;
      _local_aa0 = auVar137;
      _local_a90 = auVar141;
      _local_a80 = auVar142;
      _local_a70 = auVar90;
      _local_a60 = auVar91;
      _local_a50 = auVar92;
      _local_a40 = auVar93;
      do {
        uVar105 = 0;
        if (uVar100 != 0) {
          for (; (uVar100 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
          }
        }
        local_be8 = *(uint *)((long)&local_9a0 + uVar105 * 4);
        pGVar7 = (local_ca0->geometries).items[local_be8].ptr;
        if ((pGVar7->mask & ray->mask) == 0) {
          uVar100 = uVar100 ^ 1L << (uVar105 & 0x3f);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00b7bcb0:
            ray->tfar = -INFINITY;
            return;
          }
          local_c20._0_8_ = context->args;
          local_b60._0_8_ = uVar100;
          local_bd0.context = context->user;
          local_c00 = local_860[uVar105];
          local_bfc = local_840[uVar105];
          local_bf8 = local_820[uVar105];
          local_bf4 = local_8c0[uVar105];
          local_bf0 = *(undefined4 *)(local_8a0 + uVar105 * 4);
          local_bec = *(undefined4 *)((long)&local_9c0 + uVar105 * 4);
          local_be4 = (local_bd0.context)->instID[0];
          local_be0 = (local_bd0.context)->instPrimID[0];
          local_c40._0_4_ = ray->tfar;
          local_b80._0_8_ = uVar105;
          ray->tfar = local_860[uVar105 - 8];
          local_ccc = -1;
          local_bd0.valid = &local_ccc;
          local_bd0.geometryUserPtr = pGVar7->userPtr;
          local_bd0.hit = (RTCHitN *)&local_c00;
          local_bd0.N = 1;
          local_ba0._0_8_ = pGVar7;
          local_bd0.ray = (RTCRayN *)ray;
          if ((pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar7->occlusionFilterN)(&local_bd0), *local_bd0.valid != 0)) {
            if ((*(code **)(local_c20._0_8_ + 0x10) == (code *)0x0) ||
               ((((*(byte *)local_c20._0_8_ & 2) == 0 &&
                 ((*(byte *)(local_ba0._0_8_ + 0x3e) & 0x40) == 0)) ||
                ((**(code **)(local_c20._0_8_ + 0x10))(&local_bd0), *local_bd0.valid != 0))))
            goto LAB_00b7bcb0;
          }
          ray->tfar = (float)local_c40._0_4_;
          uVar100 = local_b60._0_8_ ^ 1L << (local_b80._0_8_ & 0x3f);
        }
      } while (uVar100 != 0);
    }
  }
  local_cc8 = local_cc8 + 1;
  auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar154 = ZEXT1664(local_ad0);
  auVar156 = ZEXT1664(local_ae0);
  auVar161 = ZEXT1664(local_af0);
  auVar169 = ZEXT1664(local_b00);
  auVar178 = ZEXT1664(local_b10);
  auVar179 = ZEXT1664(local_b20);
  auVar183 = ZEXT1664(local_b30);
  auVar191 = ZEXT1664(local_b40);
  uVar100 = local_c90;
  uVar105 = local_c98;
  goto LAB_00b7b262;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }